

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_ExtractChannel(ExtractChannelForm4 ExtractChannel)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  code *in_RDI;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  size;
  Image output;
  uint8_t channelId;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_fffffffffffffe08;
  uint32_t in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined2 in_stack_fffffffffffffe14;
  uint8_t in_stack_fffffffffffffe16;
  uint8_t in_stack_fffffffffffffe17;
  uint32_t in_stack_fffffffffffffe18;
  uint32_t in_stack_fffffffffffffe1c;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffe20;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *this;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  uint32_t *in_stack_fffffffffffffe50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint8_t value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe58;
  size_type __n;
  uint32_t in_stack_fffffffffffffe60;
  uint32_t in_stack_fffffffffffffe64;
  value_type x;
  uint32_t in_stack_fffffffffffffe68;
  value_type vVar4;
  uint32_t in_stack_fffffffffffffe6c;
  value_type vVar5;
  Image *in_stack_fffffffffffffe70;
  undefined4 local_138;
  undefined4 local_134;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  pair<unsigned_int,_unsigned_int> local_fc;
  pair<unsigned_int,_unsigned_int> local_f4;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_e8 [2];
  undefined1 local_a8 [43];
  byte local_7d;
  ImageTemplate<unsigned_char> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffe0c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe17,in_stack_fffffffffffffe16);
  Test_Helper::uniformRGBImage
            ((uint8_t)((uint)in_stack_fffffffffffffe2c >> 0x18),in_stack_fffffffffffffe20);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d3299);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_48);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_48);
  Unit_Test::fillImage
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe64,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  local_7d = Test_Helper::randomValue<unsigned_char>(0x1d32f9);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe17,in_stack_fffffffffffffe16);
  Test_Helper::uniformImage
            (in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,
             (Image *)CONCAT17(in_stack_fffffffffffffe17,
                               CONCAT16(in_stack_fffffffffffffe16,
                                        CONCAT24(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10
                                                ))));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d3354);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1d3369);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
           (allocator_type *)in_stack_fffffffffffffe20);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1d3392);
  local_f4 = Unit_Test::imageSize
                       ((Image *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  pvVar2 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](local_e8,0);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar2,&local_f4);
  local_fc = Unit_Test::imageSize
                       ((Image *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  pvVar2 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](local_e8,1);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar2,&local_fc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d343a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d344f);
  Unit_Test::generateRoi
            ((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)in_stack_fffffffffffffe70,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (uint32_t *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_118,0);
  x = *pvVar3;
  this_00 = &local_130;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
  vVar4 = *pvVar3;
  __n = 1;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_118,1);
  vVar5 = *pvVar3;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,__n);
  value = (uint8_t)((ulong)this_00 >> 0x38);
  (*local_8)(&local_48,x,vVar4,local_a8,vVar5,*pvVar3,local_134,local_138,local_7d);
  this = (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *)0x1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_118,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_130,(size_type)this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,(ulong)local_7d);
  bVar1 = Unit_Test::verifyImage
                    ((Image *)CONCAT44(vVar5,vVar4),x,in_stack_fffffffffffffe60,
                     (uint32_t)(__n >> 0x20),(uint32_t)__n,value);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(this);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d35fb);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d3608);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return bVar1;
}

Assistant:

bool form4_ExtractChannel(ExtractChannelForm4 ExtractChannel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        PenguinV_Image::Image input = uniformRGBImage( intensity[0] );
        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        const uint8_t channelId = randomValue<uint8_t>( 3 );
        PenguinV_Image::Image output = uniformImage();

        std::vector < std::pair <uint32_t, uint32_t> > size( 2 );
        size[0] = imageSize( input );
        size[1] = imageSize( output );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( size, roiX, roiY, roiWidth, roiHeight );

        ExtractChannel( input, roiX[0], roiY[0], output, roiX[1], roiY[1], roiWidth, roiHeight, channelId );

        return verifyImage( output, roiX[1], roiY[1], roiWidth, roiHeight, intensity[channelId] );
    }